

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ArrayJoinPromiseNode<int>::getNoError
          (ArrayJoinPromiseNode<int> *this,ExceptionOrValue *output)

{
  bool bVar1;
  size_t size;
  int *piVar2;
  ExceptionOr<kj::Array<int>_> *this_00;
  Array<int> local_230;
  ExceptionOr<kj::Array<int>_> local_218;
  ExceptionOr<int> *local_58;
  ExceptionOr<int> *part;
  ExceptionOr<int> *__end0;
  ExceptionOr<int> *__begin0;
  Array<kj::_::ExceptionOr<int>_> *__range3;
  ArrayBuilder<int> builder;
  ExceptionOrValue *output_local;
  ArrayJoinPromiseNode<int> *this_local;
  
  builder.disposer = (ArrayDisposer *)output;
  size = Array<kj::_::ExceptionOr<int>_>::size(&this->resultParts);
  heapArrayBuilder<int>((ArrayBuilder<int> *)&__range3,size);
  __begin0 = (ExceptionOr<int> *)&this->resultParts;
  __end0 = Array<kj::_::ExceptionOr<int>_>::begin((Array<kj::_::ExceptionOr<int>_> *)__begin0);
  part = Array<kj::_::ExceptionOr<int>_>::end((Array<kj::_::ExceptionOr<int>_> *)__begin0);
  while( true ) {
    if (__end0 == part) {
      ArrayBuilder<int>::finish(&local_230,(ArrayBuilder<int> *)&__range3);
      ExceptionOr<kj::Array<int>_>::ExceptionOr(&local_218,&local_230);
      this_00 = ExceptionOrValue::as<kj::Array<int>>((ExceptionOrValue *)builder.disposer);
      ExceptionOr<kj::Array<int>_>::operator=(this_00,&local_218);
      ExceptionOr<kj::Array<int>_>::~ExceptionOr(&local_218);
      Array<int>::~Array(&local_230);
      ArrayBuilder<int>::~ArrayBuilder((ArrayBuilder<int> *)&__range3);
      return;
    }
    local_58 = __end0;
    bVar1 = Maybe<int>::operator==(&__end0->value);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    piVar2 = readMaybe<int>(&local_58->value);
    piVar2 = mv<int>(piVar2);
    ArrayBuilder<int>::add<int>((ArrayBuilder<int> *)&__range3,piVar2);
    __end0 = __end0 + 1;
  }
  inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
             ,0x460,"part.value != kj::none",
             "\"Bug in KJ promise framework:  Promise result had neither value no exception.\"",
             "Bug in KJ promise framework:  Promise result had neither value no exception.");
}

Assistant:

void getNoError(ExceptionOrValue& output) noexcept override {
    auto builder = heapArrayBuilder<T>(resultParts.size());
    for (auto& part: resultParts) {
      KJ_IASSERT(part.value != kj::none,
                 "Bug in KJ promise framework:  Promise result had neither value no exception.");
      builder.add(kj::mv(*_::readMaybe(part.value)));
    }
    output.as<Array<T>>() = builder.finish();
  }